

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

void __thiscall single_fn::single_fn(single_fn *this,single_fn *param_1)

{
  single_fn *param_1_local;
  single_fn *this_local;
  
  std::shared_ptr<std::random_device>::shared_ptr(&this->rd,&param_1->rd);
  return;
}

Assistant:

auto operator () (Container c)
    {
        if (c.size() > 1)
        {
            std::default_random_engine engine((*rd)());
            using size_type = typename Container::size_type;
            auto uniform = std::uniform_int_distribution<size_type>(0, c.size() - 1);
            auto item = c[uniform(engine)];
            std::fill(c.begin(), c.end(), item);
        }
        return c;
    }